

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeDualActivity
          (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *dual,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *activity,bool unscaled)

{
  int *piVar1;
  uint *puVar2;
  pointer pnVar3;
  undefined8 uVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  pointer pnVar13;
  Item *pIVar14;
  cpp_dec_float<100U,_int,_void> *pcVar15;
  undefined8 *puVar16;
  int iVar17;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__range2;
  cpp_dec_float<100U,_int,_void> *pcVar18;
  long lVar19;
  cpp_dec_float<100U,_int,_void> *pcVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  cpp_dec_float<100U,_int,_void> *pcVar24;
  type t;
  cpp_dec_float<100U,_int,_void> local_a8;
  long local_58;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_50;
  
  iVar17 = (int)((ulong)((long)(dual->val).
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(dual->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333;
  if ((this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum != iVar17) {
    puVar16 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_a8.data._M_elems._0_8_ = local_a8.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,
               "XSPXLP02 Dual vector for computing dual activity has wrong dimension","");
    *puVar16 = &PTR__SPxException_0069d438;
    puVar16[1] = puVar16 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar16 + 1),local_a8.data._M_elems._0_8_,
               local_a8.data._M_elems._0_8_ + local_a8.data._M_elems._8_8_);
    *puVar16 = &PTR__SPxException_0069d410;
    __cxa_throw(puVar16,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  if ((this->
      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum !=
      (int)((ulong)((long)(activity->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(activity->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333) {
    puVar16 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_a8.data._M_elems._0_8_ = local_a8.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,
               "XSPXLP04 Activity vector computing dual activity has wrong dimension","");
    *puVar16 = &PTR__SPxException_0069d438;
    puVar16[1] = puVar16 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar16 + 1),local_a8.data._M_elems._0_8_,
               local_a8.data._M_elems._0_8_ + local_a8.data._M_elems._8_8_);
    *puVar16 = &PTR__SPxException_0069d410;
    __cxa_throw(puVar16,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  uVar21 = 0;
  if ((0 < iVar17) &&
     (pcVar18 = &((dual->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_backend,
     pcVar18->fpclass != cpp_dec_float_NaN)) {
    lVar22 = 0x98;
    uVar23 = 0;
    do {
      uVar21 = uVar23;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_a8,0,(type *)0x0);
      iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (pcVar18,&local_a8);
      iVar17 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      if (iVar12 != 0) goto LAB_00381be8;
      uVar23 = uVar21 + 1;
      if ((long)iVar17 <= (long)uVar23) break;
      pnVar13 = (dual->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar18 = &pnVar13[uVar23].m_backend;
      piVar1 = (int *)((long)(pnVar13->m_backend).data._M_elems + lVar22);
      lVar22 = lVar22 + 0x50;
    } while (*piVar1 != 2);
    uVar21 = uVar21 + 1;
  }
LAB_00381be8:
  if ((int)uVar21 < iVar17) {
    iVar17 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum;
    local_50.
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x0;
    local_50.
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memsize = 0;
    local_50.
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memused = 0;
    local_50._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a3d50;
    local_50.theelem =
         (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    iVar12 = 2;
    if (0 < iVar17) {
      iVar12 = iVar17;
    }
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::allocMem(&local_50,iVar12);
    uVar23 = uVar21 & 0xffffffff;
    if ((unscaled) && (this->_isScaled == true)) {
      (*this->lp_scaler->_vptr_SPxScaler[0x1a])(this->lp_scaler,this,uVar21 & 0xffffffff,&local_50);
      pnVar3 = (activity->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pnVar13 = (activity->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pnVar13 != pnVar3;
          pnVar13 = pnVar13 + 1) {
        (pnVar13->m_backend).fpclass = cpp_dec_float_finite;
        (pnVar13->m_backend).prec_elem = 0x10;
        (pnVar13->m_backend).data._M_elems[0] = 0;
        (pnVar13->m_backend).data._M_elems[1] = 0;
        (pnVar13->m_backend).data._M_elems[2] = 0;
        (pnVar13->m_backend).data._M_elems[3] = 0;
        (pnVar13->m_backend).data._M_elems[4] = 0;
        (pnVar13->m_backend).data._M_elems[5] = 0;
        (pnVar13->m_backend).data._M_elems[6] = 0;
        (pnVar13->m_backend).data._M_elems[7] = 0;
        (pnVar13->m_backend).data._M_elems[8] = 0;
        (pnVar13->m_backend).data._M_elems[9] = 0;
        (pnVar13->m_backend).data._M_elems[10] = 0;
        (pnVar13->m_backend).data._M_elems[0xb] = 0;
        (pnVar13->m_backend).data._M_elems[0xc] = 0;
        (pnVar13->m_backend).data._M_elems[0xd] = 0;
        (pnVar13->m_backend).data._M_elems[0xe] = 0;
        (pnVar13->m_backend).data._M_elems[0xf] = 0;
        *(undefined8 *)((long)(pnVar13->m_backend).data._M_elems + 0x3d) = 0;
      }
      if (0 < (long)local_50.
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .memused) {
        lVar22 = 0;
        do {
          iVar17 = *(int *)((long)(&(local_50.
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem)->val + 1) + lVar22);
          pnVar13 = (activity->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar16 = (undefined8 *)
                    ((long)((local_50.
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .m_elem)->val).m_backend.data._M_elems + lVar22);
          uVar4 = *puVar16;
          uVar6 = puVar16[1];
          puVar16 = (undefined8 *)
                    ((long)((local_50.
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .m_elem)->val).m_backend.data._M_elems + lVar22 + 0x10);
          uVar7 = *puVar16;
          uVar8 = puVar16[1];
          puVar16 = (undefined8 *)
                    ((long)((local_50.
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .m_elem)->val).m_backend.data._M_elems + lVar22 + 0x20);
          uVar9 = *puVar16;
          uVar10 = puVar16[1];
          puVar16 = (undefined8 *)
                    ((long)((local_50.
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .m_elem)->val).m_backend.data._M_elems + lVar22 + 0x30);
          uVar11 = puVar16[1];
          puVar2 = pnVar13[iVar17].m_backend.data._M_elems + 0xc;
          *(undefined8 *)puVar2 = *puVar16;
          *(undefined8 *)(puVar2 + 2) = uVar11;
          puVar2 = pnVar13[iVar17].m_backend.data._M_elems + 8;
          *(undefined8 *)puVar2 = uVar9;
          *(undefined8 *)(puVar2 + 2) = uVar10;
          puVar2 = pnVar13[iVar17].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar2 = uVar7;
          *(undefined8 *)(puVar2 + 2) = uVar8;
          *(undefined8 *)&pnVar13[iVar17].m_backend.data = uVar4;
          *(undefined8 *)(pnVar13[iVar17].m_backend.data._M_elems + 2) = uVar6;
          pnVar13[iVar17].m_backend.exp =
               *(int *)((long)(&((local_50.
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem)->val).m_backend.data + 1) + lVar22);
          pnVar13[iVar17].m_backend.neg =
               *(bool *)((long)(&((local_50.
                                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .m_elem)->val).m_backend.data + 1) + lVar22 + 4);
          uVar4 = *(undefined8 *)
                   ((long)(&((local_50.
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .m_elem)->val).m_backend.data + 1) + lVar22 + 8);
          pnVar13[iVar17].m_backend.fpclass = (int)uVar4;
          pnVar13[iVar17].m_backend.prec_elem = (int)((ulong)uVar4 >> 0x20);
          lVar22 = lVar22 + 0x54;
        } while ((long)local_50.
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused * 0x54 - lVar22 != 0);
      }
    }
    else {
      pIVar14 = (this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem +
                (this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[uVar23].idx;
      pnVar3 = (activity->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pnVar13 = (activity->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pnVar13 != pnVar3;
          pnVar13 = pnVar13 + 1) {
        (pnVar13->m_backend).fpclass = cpp_dec_float_finite;
        (pnVar13->m_backend).prec_elem = 0x10;
        (pnVar13->m_backend).data._M_elems[0] = 0;
        (pnVar13->m_backend).data._M_elems[1] = 0;
        (pnVar13->m_backend).data._M_elems[2] = 0;
        (pnVar13->m_backend).data._M_elems[3] = 0;
        (pnVar13->m_backend).data._M_elems[4] = 0;
        (pnVar13->m_backend).data._M_elems[5] = 0;
        (pnVar13->m_backend).data._M_elems[6] = 0;
        (pnVar13->m_backend).data._M_elems[7] = 0;
        (pnVar13->m_backend).data._M_elems[8] = 0;
        (pnVar13->m_backend).data._M_elems[9] = 0;
        (pnVar13->m_backend).data._M_elems[10] = 0;
        (pnVar13->m_backend).data._M_elems[0xb] = 0;
        (pnVar13->m_backend).data._M_elems[0xc] = 0;
        (pnVar13->m_backend).data._M_elems[0xd] = 0;
        (pnVar13->m_backend).data._M_elems[0xe] = 0;
        (pnVar13->m_backend).data._M_elems[0xf] = 0;
        *(undefined8 *)((long)(pnVar13->m_backend).data._M_elems + 0x3d) = 0;
      }
      if (0 < (pIVar14->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        lVar22 = 0x50;
        lVar19 = 0;
        do {
          pNVar5 = (pIVar14->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          iVar17 = *(int *)((long)(pNVar5->val).m_backend.data._M_elems + lVar22);
          pnVar13 = (activity->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar16 = (undefined8 *)((long)(&pNVar5->val + -1) + lVar22);
          uVar4 = *puVar16;
          uVar6 = puVar16[1];
          puVar16 = (undefined8 *)((long)(&(pNVar5->val).m_backend.data + -1) + lVar22);
          uVar7 = *puVar16;
          uVar8 = puVar16[1];
          puVar16 = (undefined8 *)((long)(pNVar5->val).m_backend.data._M_elems + lVar22 + -0x30);
          uVar9 = *puVar16;
          uVar10 = puVar16[1];
          puVar16 = (undefined8 *)((long)(pNVar5->val).m_backend.data._M_elems + lVar22 + -0x20);
          uVar11 = puVar16[1];
          puVar2 = pnVar13[iVar17].m_backend.data._M_elems + 0xc;
          *(undefined8 *)puVar2 = *puVar16;
          *(undefined8 *)(puVar2 + 2) = uVar11;
          puVar2 = pnVar13[iVar17].m_backend.data._M_elems + 8;
          *(undefined8 *)puVar2 = uVar9;
          *(undefined8 *)(puVar2 + 2) = uVar10;
          puVar2 = pnVar13[iVar17].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar2 = uVar7;
          *(undefined8 *)(puVar2 + 2) = uVar8;
          *(undefined8 *)&pnVar13[iVar17].m_backend.data = uVar4;
          *(undefined8 *)(pnVar13[iVar17].m_backend.data._M_elems + 2) = uVar6;
          pnVar13[iVar17].m_backend.exp =
               *(int *)((long)(pNVar5->val).m_backend.data._M_elems + lVar22 + -0x10);
          pnVar13[iVar17].m_backend.neg =
               *(bool *)((long)(pNVar5->val).m_backend.data._M_elems + lVar22 + -0xc);
          uVar4 = *(undefined8 *)((long)(pNVar5->val).m_backend.data._M_elems + lVar22 + -8);
          pnVar13[iVar17].m_backend.fpclass = (int)uVar4;
          pnVar13[iVar17].m_backend.prec_elem = (int)((ulong)uVar4 >> 0x20);
          lVar19 = lVar19 + 1;
          lVar22 = lVar22 + 0x54;
        } while (lVar19 < (pIVar14->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused);
      }
    }
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator*=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)activity,
                 (dual->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar23);
    if ((int)uVar21 + 1 <
        (this->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum) {
      lVar22 = uVar23 + 1;
      pcVar18 = &local_a8;
      do {
        pnVar13 = (dual->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_58 = lVar22;
        if (pnVar13[lVar22].m_backend.fpclass == cpp_dec_float_NaN) {
LAB_00381e9f:
          if ((unscaled) && (this->_isScaled == true)) {
            (*this->lp_scaler->_vptr_SPxScaler[0x1a])(this->lp_scaler,this,local_58,&local_50);
            lVar19 = (long)local_50.
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused;
            if (0 < lVar19) {
              pcVar24 = &(dual->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar22].m_backend;
              uVar21 = lVar19 + 1;
              lVar22 = lVar19 * 0x54;
              do {
                pcVar15 = (cpp_dec_float<100U,_int,_void> *)
                          ((long)local_50.
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem[-1].val.m_backend.data._M_elems + lVar22);
                pcVar20 = pcVar15;
                if (pcVar15 == pcVar18) {
                  pcVar20 = pcVar24;
                }
                local_a8.fpclass = cpp_dec_float_finite;
                local_a8.prec_elem = 0x10;
                local_a8.data._M_elems[0] = 0;
                local_a8.data._M_elems[1] = 0;
                local_a8.data._M_elems[2] = 0;
                local_a8.data._M_elems[3] = 0;
                local_a8.data._M_elems[4] = 0;
                local_a8.data._M_elems[5] = 0;
                local_a8.data._M_elems[6] = 0;
                local_a8.data._M_elems[7] = 0;
                local_a8.data._M_elems[8] = 0;
                local_a8.data._M_elems[9] = 0;
                local_a8.data._M_elems[10] = 0;
                local_a8.data._M_elems[0xb] = 0;
                local_a8.data._M_elems[0xc] = 0;
                local_a8.data._M_elems[0xd] = 0;
                local_a8.data._M_elems._56_5_ = 0;
                local_a8.data._M_elems[0xf]._1_3_ = 0;
                local_a8.exp = 0;
                local_a8.neg = false;
                if ((pcVar18 != pcVar24) && (pcVar15 != pcVar18)) {
                  local_a8.data._M_elems._0_8_ = *(undefined8 *)(pcVar24->data)._M_elems;
                  local_a8.data._M_elems._8_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 2);
                  local_a8.data._M_elems._16_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 4);
                  local_a8.data._M_elems._24_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 6);
                  local_a8.data._M_elems._32_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 8);
                  local_a8.data._M_elems._40_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 10);
                  local_a8.data._M_elems._48_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 0xc);
                  uVar4 = *(undefined8 *)((pcVar24->data)._M_elems + 0xe);
                  local_a8.data._M_elems._56_5_ = SUB85(uVar4,0);
                  local_a8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                  local_a8.exp = pcVar24->exp;
                  local_a8.neg = pcVar24->neg;
                  local_a8.fpclass = pcVar24->fpclass;
                  local_a8.prec_elem = pcVar24->prec_elem;
                  pcVar20 = pcVar15;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                          (pcVar18,pcVar20);
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (&(activity->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start
                            [*(int *)((long)(&local_50.
                                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              .m_elem[-1].val + 1) + lVar22)].m_backend,pcVar18);
                uVar21 = uVar21 - 1;
                lVar22 = lVar22 + -0x54;
              } while (1 < uVar21);
            }
          }
          else {
            pIVar14 = (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.theitem;
            iVar17 = (this->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thekey[local_58].idx;
            lVar19 = (long)pIVar14[iVar17].data.
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused;
            if (0 < lVar19) {
              pcVar24 = &(dual->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar22].m_backend;
              pIVar14 = pIVar14 + iVar17;
              uVar21 = lVar19 + 1;
              lVar22 = lVar19 * 0x54;
              do {
                pcVar15 = (cpp_dec_float<100U,_int,_void> *)
                          ((long)(pIVar14->data).
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem[-1].val.m_backend.data._M_elems + lVar22);
                pcVar20 = pcVar15;
                if (pcVar15 == pcVar18) {
                  pcVar20 = pcVar24;
                }
                local_a8.fpclass = cpp_dec_float_finite;
                local_a8.prec_elem = 0x10;
                local_a8.data._M_elems[0] = 0;
                local_a8.data._M_elems[1] = 0;
                local_a8.data._M_elems[2] = 0;
                local_a8.data._M_elems[3] = 0;
                local_a8.data._M_elems[4] = 0;
                local_a8.data._M_elems[5] = 0;
                local_a8.data._M_elems[6] = 0;
                local_a8.data._M_elems[7] = 0;
                local_a8.data._M_elems[8] = 0;
                local_a8.data._M_elems[9] = 0;
                local_a8.data._M_elems[10] = 0;
                local_a8.data._M_elems[0xb] = 0;
                local_a8.data._M_elems[0xc] = 0;
                local_a8.data._M_elems[0xd] = 0;
                local_a8.data._M_elems._56_5_ = 0;
                local_a8.data._M_elems[0xf]._1_3_ = 0;
                local_a8.exp = 0;
                local_a8.neg = false;
                if ((pcVar18 != pcVar24) && (pcVar15 != pcVar18)) {
                  local_a8.data._M_elems._0_8_ = *(undefined8 *)(pcVar24->data)._M_elems;
                  local_a8.data._M_elems._8_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 2);
                  local_a8.data._M_elems._16_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 4);
                  local_a8.data._M_elems._24_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 6);
                  local_a8.data._M_elems._32_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 8);
                  local_a8.data._M_elems._40_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 10);
                  local_a8.data._M_elems._48_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 0xc);
                  uVar4 = *(undefined8 *)((pcVar24->data)._M_elems + 0xe);
                  local_a8.data._M_elems._56_5_ = SUB85(uVar4,0);
                  local_a8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                  local_a8.exp = pcVar24->exp;
                  local_a8.neg = pcVar24->neg;
                  local_a8.fpclass = pcVar24->fpclass;
                  local_a8.prec_elem = pcVar24->prec_elem;
                  pcVar20 = pcVar15;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                          (pcVar18,pcVar20);
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (&(activity->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start
                            [*(int *)((long)(&(pIVar14->data).
                                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              .m_elem[-1].val + 1) + lVar22)].m_backend,pcVar18);
                uVar21 = uVar21 - 1;
                lVar22 = lVar22 + -0x54;
              } while (1 < uVar21);
            }
          }
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                    (pcVar18,0,(type *)0x0);
          iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&pnVar13[lVar22].m_backend,pcVar18);
          if (iVar17 != 0) goto LAB_00381e9f;
        }
        lVar22 = local_58 + 1;
      } while ((int)lVar22 <
               (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
    }
    local_50._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a3d50;
    if (local_50.theelem !=
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      free(local_50.theelem);
    }
  }
  else {
    pnVar3 = (activity->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pnVar13 = (activity->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pnVar13 != pnVar3;
        pnVar13 = pnVar13 + 1) {
      (pnVar13->m_backend).fpclass = cpp_dec_float_finite;
      (pnVar13->m_backend).prec_elem = 0x10;
      (pnVar13->m_backend).data._M_elems[0] = 0;
      (pnVar13->m_backend).data._M_elems[1] = 0;
      (pnVar13->m_backend).data._M_elems[2] = 0;
      (pnVar13->m_backend).data._M_elems[3] = 0;
      (pnVar13->m_backend).data._M_elems[4] = 0;
      (pnVar13->m_backend).data._M_elems[5] = 0;
      (pnVar13->m_backend).data._M_elems[6] = 0;
      (pnVar13->m_backend).data._M_elems[7] = 0;
      (pnVar13->m_backend).data._M_elems[8] = 0;
      (pnVar13->m_backend).data._M_elems[9] = 0;
      (pnVar13->m_backend).data._M_elems[10] = 0;
      (pnVar13->m_backend).data._M_elems[0xb] = 0;
      (pnVar13->m_backend).data._M_elems[0xc] = 0;
      (pnVar13->m_backend).data._M_elems[0xd] = 0;
      (pnVar13->m_backend).data._M_elems[0xe] = 0;
      (pnVar13->m_backend).data._M_elems[0xf] = 0;
      *(undefined8 *)((long)(pnVar13->m_backend).data._M_elems + 0x3d) = 0;
    }
  }
  return;
}

Assistant:

inline
void SPxLPBase<R>::computeDualActivity(const VectorBase<R>& dual, VectorBase<R>& activity,
                                       const bool unscaled) const
{
   if(dual.dim() != nRows())
      throw SPxInternalCodeException("XSPXLP02 Dual vector for computing dual activity has wrong dimension");

   if(activity.dim() != nCols())
      throw SPxInternalCodeException("XSPXLP04 Activity vector computing dual activity has wrong dimension");

   int r;

   for(r = 0; r < nRows() && dual[r] == 0; r++)
      ;

   if(r >= nRows())
   {
      activity.clear();
      return;
   }

   DSVectorBase<R> tmp(nCols());

   if(unscaled && _isScaled)
   {
      lp_scaler->getRowUnscaled(*this, r, tmp);
      activity = tmp;
   }
   else
      activity = rowVector(r);

   activity *= dual[r];
   r++;

   for(; r < nRows(); r++)
   {
      if(dual[r] != 0)
      {
         if(unscaled && _isScaled)
         {
            lp_scaler->getRowUnscaled(*this, r, tmp);
            activity.multAdd(dual[r], tmp);
         }
         else
            activity.multAdd(dual[r], rowVector(r));
      }
   }
}